

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

string * __thiscall ZXing::ToString_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,Error *e)

{
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             &DAT_0019a7b8 + *(int *)(&DAT_0019a7b8 + (ulong)(byte)this[0x2a] * 4),
             (allocator<char> *)&local_70);
  if (*(long *)(this + 8) != 0) {
    std::operator+(&local_50," (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::operator+(&local_70,&local_50,")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  Error::location_abi_cxx11_(&local_70,(Error *)this);
  if (local_70._M_string_length != 0) {
    Error::location_abi_cxx11_(&local_30,(Error *)this);
    std::operator+(&local_50," @ ",&local_30);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const Error& e)
{
	const char* name[] = {"", "FormatError", "ChecksumError", "Unsupported"};
	std::string ret = name[static_cast<int>(e.type())];
	if (!e.msg().empty())
		ret += " (" + e.msg() + ")";
	if (auto location = e.location(); !location.empty())
		ret += " @ " + e.location();
	return ret;
}